

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scene_points.h
# Opt level: O2

BBox3fa * __thiscall
embree::sse2::PointsISA::vbounds(BBox3fa *__return_storage_ptr__,PointsISA *this,size_t i)

{
  float *pfVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  
  pfVar1 = (float *)(*(long *)&(this->super_Points).super_Geometry.field_0x58 +
                    i * *(long *)&(this->super_Points).field_0x68);
  fVar3 = *pfVar1;
  fVar4 = pfVar1[1];
  fVar5 = pfVar1[2];
  fVar6 = pfVar1[3];
  fVar2 = (this->super_Points).maxRadiusScale;
  (__return_storage_ptr__->lower).field_0.m128[0] = fVar3 - fVar2 * fVar6;
  (__return_storage_ptr__->lower).field_0.m128[1] = fVar4 - fVar2 * fVar6;
  (__return_storage_ptr__->lower).field_0.m128[2] = fVar5 - fVar2 * fVar6;
  (__return_storage_ptr__->lower).field_0.m128[3] = fVar6 - fVar2 * fVar6;
  (__return_storage_ptr__->upper).field_0.m128[0] = fVar2 * fVar6 + fVar3;
  (__return_storage_ptr__->upper).field_0.m128[1] = fVar2 * fVar6 + fVar4;
  (__return_storage_ptr__->upper).field_0.m128[2] = fVar2 * fVar6 + fVar5;
  (__return_storage_ptr__->upper).field_0.m128[3] = fVar2 * fVar6 + fVar6;
  return __return_storage_ptr__;
}

Assistant:

BBox3fa vbounds(size_t i) const
      {
        return bounds(i);
      }